

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_ifelse::run_impl(statement_ifelse *this)

{
  context_t *pcVar1;
  bool bVar2;
  element_type *peVar3;
  stack_pointer psVar4;
  _Elt_pointer ppsVar5;
  statement_base *psVar6;
  undefined *puVar7;
  bool *pbVar8;
  _Elt_pointer ppsVar9;
  stack_pointer psVar10;
  _Map_pointer pppsVar11;
  _Elt_pointer ppsVar12;
  scope_guard scope;
  runtime_type local_100;
  
  local_100.literals.
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .slots_ = (slot_type *)(this->mTree).mRoot;
  runtime_type::parse_expr
            (&local_100,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&local_100.literals.
                    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                    .
                    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                    .slots_,0));
  pbVar8 = cs_impl::any::const_val<bool>((any *)&local_100);
  pcVar1 = &(this->super_statement_base).context;
  bVar2 = *pbVar8;
  cs_impl::any::recycle((any *)&local_100);
  local_100.literals.
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = (ctrl_t *)pcVar1;
  if (bVar2 == true) {
    peVar3 = (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar4 = *(peVar3->super_runtime_type).storage.fiber_stack;
    psVar10 = &(peVar3->super_runtime_type).storage.m_data;
    if (psVar4 != (stack_pointer)0x0) {
      psVar10 = psVar4;
    }
    stack_type<cs::domain_type,_std::allocator>::push<>(psVar10);
    ppsVar12 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar12 != ppsVar5) {
      ppsVar9 = (this->mBlock).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar11 = (this->mBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar7 = current_process;
        psVar6 = *ppsVar12;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar7 + 0xd0),(void *)0x0);
        }
        (*psVar6->_vptr_statement_base[3])(psVar6);
        peVar3 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((peVar3->return_fcall != false) || (peVar3->break_block != false)) ||
           (peVar3->continue_block != false)) break;
        ppsVar12 = ppsVar12 + 1;
        if (ppsVar12 == ppsVar9) {
          ppsVar12 = pppsVar11[1];
          pppsVar11 = pppsVar11 + 1;
          ppsVar9 = ppsVar12 + 0x40;
        }
      } while (ppsVar12 != ppsVar5);
    }
  }
  else {
    peVar3 = (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar4 = *(peVar3->super_runtime_type).storage.fiber_stack;
    psVar10 = &(peVar3->super_runtime_type).storage.m_data;
    if (psVar4 != (stack_pointer)0x0) {
      psVar10 = psVar4;
    }
    stack_type<cs::domain_type,_std::allocator>::push<>(psVar10);
    ppsVar12 = (this->mElseBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar5 = (this->mElseBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar12 != ppsVar5) {
      ppsVar9 = (this->mElseBlock).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar11 = (this->mElseBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar7 = current_process;
        psVar6 = *ppsVar12;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar7 + 0xd0),(void *)0x0);
        }
        (*psVar6->_vptr_statement_base[3])(psVar6);
        peVar3 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((peVar3->return_fcall != false) || (peVar3->break_block != false)) ||
           (peVar3->continue_block != false)) break;
        ppsVar12 = ppsVar12 + 1;
        if (ppsVar12 == ppsVar9) {
          ppsVar12 = pppsVar11[1];
          pppsVar11 = pppsVar11 + 1;
          ppsVar9 = ppsVar12 + 0x40;
        }
      } while (ppsVar12 != ppsVar5);
    }
  }
  scope_guard::~scope_guard((scope_guard *)&local_100);
  return;
}

Assistant:

void statement_ifelse::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
		else {
			scope_guard scope(context);
			for (auto &ptr: mElseBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}